

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-math.cc
# Opt level: O3

void math_sin_pi_test(void)

{
  int i;
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  uVar2 = 0xfffffe98;
  dVar3 = -360.0;
  do {
    dVar4 = sin((dVar3 * 3.141592653589793) / 180.0);
    dVar5 = tinyusdz::math::sin_pi_imp<double>(dVar3 / 180.0);
    if (1.1102230246251565e-15 < ABS(dVar4 - dVar5)) {
      dVar6 = ABS(dVar4);
      dVar7 = ABS(dVar5);
      dVar8 = dVar7;
      if (dVar7 <= dVar6) {
        dVar8 = dVar6;
      }
      if ((double)(~-(ulong)NAN(dVar6) & (ulong)dVar8 | -(ulong)NAN(dVar6) & (ulong)dVar7) *
          1.1102230246251565e-15 < ABS(dVar4 - dVar5)) {
        printf("sin(%d degree) differes: ref = %lf, sin_pi = %lf\n",dVar4,uVar2);
        acutest_check_(0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                       ,0x1e,"%s","0");
      }
    }
    dVar3 = dVar3 + 1.0;
    uVar1 = (int)uVar2 + 1;
    uVar2 = (ulong)uVar1;
  } while (uVar1 != 0x169);
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x21,"%s","1");
  return;
}

Assistant:

void math_sin_pi_test(void) {

  double kPI = math::constants<double>::pi();

  for (int i = -360; i <= 360; i++) {
    double ref_v = std::sin(double(i) * kPI / 180.0);
    double sin_v = math::sin_pi(double(i)/180.0);
    // TODO: dyanmically change eps based on input degree value.
    if (!math::is_close(ref_v, sin_v, 5*std::numeric_limits<double>::epsilon())) {
      printf("sin(%d degree) differes: ref = %lf, sin_pi = %lf\n", i, ref_v, sin_v);
      TEST_CHECK(0);
    }
  }
  TEST_CHECK(1); // ok
}